

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O1

int OpenFiles(Context *context)

{
  bool bVar1;
  int __fd;
  FILE *pFVar2;
  int iVar3;
  
  context->fin = (FILE *)0x0;
  if (context->current_input_path == (char *)0x0) {
    pFVar2 = fdopen(0,"rb");
    context->fin = (FILE *)pFVar2;
  }
  else {
    pFVar2 = fopen(context->current_input_path,"rb");
    context->fin = (FILE *)pFVar2;
    if (pFVar2 == (FILE *)0x0) {
      OpenFiles_cold_1();
      bVar1 = false;
      iVar3 = 0;
      goto LAB_001043cd;
    }
  }
  iVar3 = 1;
  bVar1 = true;
LAB_001043cd:
  if ((bVar1) && (context->test_integrity == 0)) {
    context->fout = (FILE *)0x0;
    if (context->current_output_path == (char *)0x0) {
      iVar3 = 1;
      pFVar2 = fdopen(1,"wb");
      context->fout = (FILE *)pFVar2;
    }
    else {
      iVar3 = 0;
      __fd = open(context->current_output_path,(uint)(context->force_overwrite == 0) << 7 | 0x241,
                  0x180);
      if (__fd < 0) {
        OpenFiles_cold_3();
      }
      else {
        pFVar2 = fdopen(__fd,"wb");
        context->fout = (FILE *)pFVar2;
        iVar3 = 1;
        if (pFVar2 == (FILE *)0x0) {
          OpenFiles_cold_2();
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static BROTLI_BOOL OpenFiles(Context* context) {
  BROTLI_BOOL is_ok = OpenInputFile(context->current_input_path, &context->fin);
  if (!context->test_integrity && is_ok) {
    is_ok = OpenOutputFile(
        context->current_output_path, &context->fout, context->force_overwrite);
  }
  return is_ok;
}